

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O0

NS * __thiscall NS::get_all(NS *this,CType *data)

{
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  *in_RDX;
  function<bool_(N_*)> *in_RSI;
  anon_class_40_1_898a9ca8 *in_RDI;
  Prep in_stack_ffffffffffffffc0;
  NS *in_stack_ffffffffffffffc8;
  
  std::
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
  ::variant(&in_RDI->data,in_RDX);
  std::function<bool(N*)>::
  function<NS::get_all(std::variant<std::__cxx11::string,int,double,NS*>)::__0,void>(in_RSI,in_RDI);
  get_all(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::function<bool_(N_*)>::~function((function<bool_(N_*)> *)0x196044);
  get_all(std::variant<std::__cxx11::string,int,double,NS*>)::$_0::~__0
            ((anon_class_40_1_898a9ca8 *)0x19604e);
  return (NS *)in_RDI;
}

Assistant:

NS NS::get_all(CType data) {
    return get_all((Prep)[data](N* n){return n->data == data;});
}